

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void addition_suite::add_integer_with_array(void)

{
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_158;
  error *ex;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_a8 [64];
  basic_variable<std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_38,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_108,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,"alpha");
  local_a8._0_8_ = &local_108;
  local_a8._8_8_ = 2;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_a8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_a8._0_8_,init);
  trial::dynamic::operator+
            (&local_68,(basic_variable<std::allocator<char>_> *)local_38,
             (basic_variable<std::allocator<char>_> *)(local_a8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_a8 + 0x10));
  local_158 = (basic_variable<std::allocator<char>_> *)local_a8;
  do {
    local_158 = local_158 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_158);
  } while (local_158 != &local_108);
  trial::protocol::core::detail::throw_failed_impl
            ("data + array::make({ true, \"alpha\" })","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9bf,"void addition_suite::add_integer_with_array()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void add_integer_with_array()
{
    variable data(2);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data + array::make({ true, "alpha" }),
                                    error,
                                    "incompatible type");
}